

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderCopyDockSpace
               (ImGuiID src_dockspace_id,ImGuiID dst_dockspace_id,
               ImVector<const_char_*> *in_window_remap_pairs)

{
  ImGuiID node_id;
  char *data_p;
  char *dst_name;
  _Bool _Var1;
  char **ppcVar2;
  ImGuiWindow_conflict *pIVar3;
  ImGuiWindowSettings *pIVar4;
  uint *puVar5;
  ImGuiDockNode *pIVar6;
  ImGuiWindow_conflict **ppIVar7;
  int dock_remap_n;
  ImGuiID IVar8;
  int window_n;
  int iVar9;
  int remap_window_n;
  uint uVar10;
  ImGuiID src_window_id;
  ImVector<unsigned_int> node_remap_pairs;
  ImVector<unsigned_int> src_windows;
  
  if (src_dockspace_id == 0) {
    __assert_fail("src_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3db8,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (dst_dockspace_id == 0) {
    __assert_fail("dst_dockspace_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3db9,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if (in_window_remap_pairs == (ImVector<const_char_*> *)0x0) {
    __assert_fail("in_window_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3dba,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  if ((in_window_remap_pairs->Size & 1) != 0) {
    __assert_fail("(in_window_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3dbb,
                  "void ImGui::DockBuilderCopyDockSpace(ImGuiID, ImGuiID, ImVector<const char *> *)"
                 );
  }
  node_remap_pairs.Size = 0;
  node_remap_pairs.Capacity = 0;
  node_remap_pairs.Data = (uint *)0x0;
  DockBuilderCopyNode(src_dockspace_id,dst_dockspace_id,&node_remap_pairs);
  src_windows.Size = 0;
  src_windows.Capacity = 0;
  src_windows.Data = (uint *)0x0;
  uVar10 = 0;
  do {
    if (in_window_remap_pairs->Size <= (int)uVar10) {
      for (uVar10 = 0; (int)uVar10 < node_remap_pairs.Size; uVar10 = uVar10 + 2) {
        puVar5 = ImVector<unsigned_int>::operator[](&node_remap_pairs,uVar10);
        IVar8 = *puVar5;
        if (IVar8 != 0) {
          puVar5 = ImVector<unsigned_int>::operator[](&node_remap_pairs,uVar10 | 1);
          node_id = *puVar5;
          pIVar6 = DockBuilderGetNode(IVar8);
          for (iVar9 = 0; iVar9 < (pIVar6->Windows).Size; iVar9 = iVar9 + 1) {
            ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&pIVar6->Windows,iVar9);
            pIVar3 = *ppIVar7;
            _Var1 = ImVector<unsigned_int>::contains(&src_windows,&pIVar3->ID);
            if (!_Var1) {
              DockBuilderDockWindow(pIVar3->Name,node_id);
            }
          }
        }
      }
      ImVector<unsigned_int>::~ImVector(&src_windows);
      ImVector<unsigned_int>::~ImVector(&node_remap_pairs);
      return;
    }
    ppcVar2 = ImVector<const_char_*>::operator[](in_window_remap_pairs,uVar10);
    data_p = *ppcVar2;
    ppcVar2 = ImVector<const_char_*>::operator[](in_window_remap_pairs,uVar10 | 1);
    dst_name = *ppcVar2;
    src_window_id = ImHashStr(data_p,0,0);
    ImVector<unsigned_int>::push_back(&src_windows,&src_window_id);
    IVar8 = src_window_id;
    pIVar3 = FindWindowByID(src_window_id);
    if (pIVar3 == (ImGuiWindow_conflict *)0x0) {
      pIVar4 = FindWindowSettings(IVar8);
      if (pIVar4 == (ImGuiWindowSettings *)0x0) {
        IVar8 = 0;
      }
      else {
        IVar8 = pIVar4->DockId;
      }
    }
    else {
      IVar8 = pIVar3->DockId;
    }
    for (iVar9 = 1; iVar9 + -1 < node_remap_pairs.Size; iVar9 = iVar9 + 2) {
      puVar5 = ImVector<unsigned_int>::operator[](&node_remap_pairs,iVar9 + -1);
      if (*puVar5 == IVar8) {
        puVar5 = ImVector<unsigned_int>::operator[](&node_remap_pairs,iVar9);
        if (*puVar5 != 0) {
          DockBuilderDockWindow(dst_name,*puVar5);
          goto LAB_001c867c;
        }
        break;
      }
    }
    DockBuilderCopyWindowSettings(data_p,dst_name);
LAB_001c867c:
    uVar10 = uVar10 + 2;
  } while( true );
}

Assistant:

void ImGui::DockBuilderCopyDockSpace(ImGuiID src_dockspace_id, ImGuiID dst_dockspace_id, ImVector<const char*>* in_window_remap_pairs)
{
    IM_ASSERT(src_dockspace_id != 0);
    IM_ASSERT(dst_dockspace_id != 0);
    IM_ASSERT(in_window_remap_pairs != NULL);
    IM_ASSERT((in_window_remap_pairs->Size % 2) == 0);

    // Duplicate entire dock
    // FIXME: When overwriting dst_dockspace_id, windows that aren't part of our dockspace window class but that are docked in a same node will be split apart,
    // whereas we could attempt to at least keep them together in a new, same floating node.
    ImVector<ImGuiID> node_remap_pairs;
    DockBuilderCopyNode(src_dockspace_id, dst_dockspace_id, &node_remap_pairs);

    // Attempt to transition all the upcoming windows associated to dst_dockspace_id into the newly created hierarchy of dock nodes
    // (The windows associated to src_dockspace_id are staying in place)
    ImVector<ImGuiID> src_windows;
    for (int remap_window_n = 0; remap_window_n < in_window_remap_pairs->Size; remap_window_n += 2)
    {
        const char* src_window_name = (*in_window_remap_pairs)[remap_window_n];
        const char* dst_window_name = (*in_window_remap_pairs)[remap_window_n + 1];
        ImGuiID src_window_id = ImHashStr(src_window_name);
        src_windows.push_back(src_window_id);

        // Search in the remapping tables
        ImGuiID src_dock_id = 0;
        if (ImGuiWindow* src_window = FindWindowByID(src_window_id))
            src_dock_id = src_window->DockId;
        else if (ImGuiWindowSettings* src_window_settings = FindWindowSettings(src_window_id))
            src_dock_id = src_window_settings->DockId;
        ImGuiID dst_dock_id = 0;
        for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
            if (node_remap_pairs[dock_remap_n] == src_dock_id)
            {
                dst_dock_id = node_remap_pairs[dock_remap_n + 1];
                //node_remap_pairs[dock_remap_n] = node_remap_pairs[dock_remap_n + 1] = 0; // Clear
                break;
            }

        if (dst_dock_id != 0)
        {
            // Docked windows gets redocked into the new node hierarchy.
            IMGUI_DEBUG_LOG_DOCKING("Remap live window '%s' 0x%08X -> '%s' 0x%08X\n", src_window_name, src_dock_id, dst_window_name, dst_dock_id);
            DockBuilderDockWindow(dst_window_name, dst_dock_id);
        }
        else
        {
            // Floating windows gets their settings transferred (regardless of whether the new window already exist or not)
            // When this is leading to a Copy and not a Move, we would get two overlapping floating windows. Could we possibly dock them together?
            IMGUI_DEBUG_LOG_DOCKING("Remap window settings '%s' -> '%s'\n", src_window_name, dst_window_name);
            DockBuilderCopyWindowSettings(src_window_name, dst_window_name);
        }
    }

    // Anything else in the source nodes of 'node_remap_pairs' are windows that were docked in src_dockspace_id but are not owned by it (unaffiliated windows, e.g. "ImGui Demo")
    // Find those windows and move to them to the cloned dock node. This may be optional?
    for (int dock_remap_n = 0; dock_remap_n < node_remap_pairs.Size; dock_remap_n += 2)
        if (ImGuiID src_dock_id = node_remap_pairs[dock_remap_n])
        {
            ImGuiID dst_dock_id = node_remap_pairs[dock_remap_n + 1];
            ImGuiDockNode* node = DockBuilderGetNode(src_dock_id);
            for (int window_n = 0; window_n < node->Windows.Size; window_n++)
            {
                ImGuiWindow* window = node->Windows[window_n];
                if (src_windows.contains(window->ID))
                    continue;

                // Docked windows gets redocked into the new node hierarchy.
                IMGUI_DEBUG_LOG_DOCKING("Remap window '%s' %08X -> %08X\n", window->Name, src_dock_id, dst_dock_id);
                DockBuilderDockWindow(window->Name, dst_dock_id);
            }
        }
}